

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleConsensusProblem.hpp
# Opt level: O2

void __thiscall
opengv::sac::SampleConsensusProblem<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::SampleConsensusProblem
          (SampleConsensusProblem<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *this,bool randomSeed)

{
  mt19937 *this_00;
  param_type *__p;
  ulong uVar1;
  function<int_()> *__p_00;
  result_type_conflict __sd;
  _Bind<std::uniform_int_distribution<int>_(std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>)>
  local_13b8;
  
  this_00 = &this->rng_alg_;
  this->_vptr_SampleConsensusProblem = (_func_int **)&PTR__SampleConsensusProblem_003e7818;
  this->max_sample_checks_ = 10;
  (this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->indices_).
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->indices_).
  super___shared_ptr<std::vector<int,_std::allocator<int>_>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->shuffled_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::mersenne_twister_engine(this_00);
  (this->rng_dist_).
  super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->rng_dist_).
  super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->rng_gen_).super___shared_ptr<std::function<int_()>,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->rng_gen_).super___shared_ptr<std::function<int_()>,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  __p = (param_type *)operator_new(8);
  __p->_M_a = 0;
  __p->_M_b = 0x7fffffff;
  std::__shared_ptr<std::uniform_int_distribution<int>,(__gnu_cxx::_Lock_policy)2>::
  reset<std::uniform_int_distribution<int>>
            ((__shared_ptr<std::uniform_int_distribution<int>,(__gnu_cxx::_Lock_policy)2> *)
             &this->rng_dist_,(uniform_int_distribution<int> *)__p);
  __sd = 0x3039;
  if (randomSeed) {
    uVar1 = time((time_t *)0x0);
    __sd = uVar1 & 0xffffffff;
  }
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(this_00,__sd);
  __p_00 = (function<int_()> *)operator_new(0x20);
  local_13b8._M_f._M_param =
       ((this->rng_dist_).
        super___shared_ptr<std::uniform_int_distribution<int>,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
       _M_param;
  memcpy(&local_13b8._M_bound_args,this_00,5000);
  std::function<int()>::
  function<std::_Bind<std::uniform_int_distribution<int>(std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>)>,void>
            ((function<int()> *)__p_00,&local_13b8);
  std::__shared_ptr<std::function<int()>,(__gnu_cxx::_Lock_policy)2>::reset<std::function<int()>>
            ((__shared_ptr<std::function<int()>,(__gnu_cxx::_Lock_policy)2> *)&this->rng_gen_,__p_00
            );
  return;
}

Assistant:

opengv::sac::SampleConsensusProblem<M>::SampleConsensusProblem(
    bool randomSeed) :
    max_sample_checks_(10)
{
  rng_dist_.reset(new std::uniform_int_distribution<>( 0, std::numeric_limits<int>::max() ));
  // Create a random number generator object
  if(randomSeed)
    rng_alg_.seed(static_cast<unsigned> (std::time(0)));
  else
    rng_alg_.seed(12345u);

  rng_gen_.reset(new std::function<int()>(std::bind(*rng_dist_, rng_alg_)));
}